

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_doing(connectdata *conn,_Bool *dophase_done)

{
  CURLcode local_1c;
  CURLcode result;
  _Bool *dophase_done_local;
  connectdata *conn_local;
  
  local_1c = pop3_multi_statemach(conn,dophase_done);
  if ((local_1c == CURLE_OK) && ((*dophase_done & 1U) != 0)) {
    local_1c = pop3_dophase_done(conn,false);
  }
  return local_1c;
}

Assistant:

static CURLcode pop3_doing(struct connectdata *conn, bool *dophase_done)
{
  CURLcode result = pop3_multi_statemach(conn, dophase_done);

  if(result)
    DEBUGF(infof(conn->data, "DO phase failed\n"));
  else if(*dophase_done) {
    result = pop3_dophase_done(conn, FALSE /* not connected */);

    DEBUGF(infof(conn->data, "DO phase is complete\n"));
  }

  return result;
}